

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filecollection.cpp
# Opt level: O0

int CFileCollection::FilelistCallback(char *pFilename,int IsDir,int StorageType,void *pUser)

{
  bool bVar1;
  CFileCollection *in_RCX;
  undefined4 in_EDX;
  int in_ESI;
  long in_RDI;
  int64 Timestamp;
  CFileCollection *pThis;
  char *in_stack_ffffffffffffffd0;
  CFileCollection *Timestamp_00;
  
  if ((in_ESI == 0) &&
     (Timestamp_00 = in_RCX, bVar1 = IsFilenameValid(in_RCX,in_stack_ffffffffffffffd0), bVar1)) {
    ExtractTimestamp(in_RCX,(char *)(in_RDI + in_RCX->m_FileDescLength + 1));
    AddEntry((CFileCollection *)CONCAT44(in_ESI,in_EDX),(int64)Timestamp_00);
  }
  return 0;
}

Assistant:

int CFileCollection::FilelistCallback(const char *pFilename, int IsDir, int StorageType, void *pUser)
{
	CFileCollection *pThis = static_cast<CFileCollection *>(pUser);

	// check for valid file name format
	if(IsDir || !pThis->IsFilenameValid(pFilename))
		return 0;

	// extract the timestamp
	int64 Timestamp = pThis->ExtractTimestamp(pFilename+pThis->m_FileDescLength+1);

	// add the entry
	pThis->AddEntry(Timestamp);

	return 0;
}